

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadString(CodedInputStream *this,string *buffer,int size)

{
  int iVar1;
  int in_EDX;
  CodedInputStream *in_RDI;
  pair<char_*,_bool> pVar2;
  pair<char_*,_bool> z;
  size_t in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff70;
  CodedInputStream *in_stack_ffffffffffffff78;
  bool local_1;
  
  if (in_EDX < 0) {
    local_1 = false;
  }
  else {
    iVar1 = BufferSize(in_RDI);
    if (iVar1 < in_EDX) {
      local_1 = ReadStringFallback(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                   (int)((ulong)in_RDI >> 0x20));
    }
    else {
      STLStringResizeUninitialized(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      pVar2 = as_string_data(in_stack_ffffffffffffff70);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        memcpy(pVar2.first,in_RDI->buffer_,(long)in_EDX);
        Advance(in_RDI,in_EDX);
      }
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool CodedInputStream::ReadString(std::string* buffer, int size) {
  if (size < 0) return false;  // security: size is often user-supplied

  if (BufferSize() >= size) {
    STLStringResizeUninitialized(buffer, size);
    std::pair<char*, bool> z = as_string_data(buffer);
    if (z.second) {
      // Oddly enough, memcpy() requires its first two args to be non-NULL even
      // if we copy 0 bytes.  So, we have ensured that z.first is non-NULL here.
      GOOGLE_DCHECK(z.first != NULL);
      memcpy(z.first, buffer_, size);
      Advance(size);
    }
    return true;
  }

  return ReadStringFallback(buffer, size);
}